

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_algorithm_t psa_key_policy_algorithm_intersection(psa_algorithm_t alg1,psa_algorithm_t alg2)

{
  uint uVar1;
  
  if (alg1 != alg2) {
    uVar1 = alg1 & 0xffffff00 | 0x10000;
    if ((((uVar1 == 0x10030000) || ((alg1 & 0xfffeff00 | 0x20000) == 0x10060000)) &&
        (((alg2 & 0xffffff00 | 0x10000) == 0x10030000 ||
         ((alg2 & 0xfffeff00 | 0x20000) == 0x10060000)))) &&
       ((alg1 & 0xffffff00) == (alg2 & 0xffffff00))) {
      if (((uVar1 == 0x10030000) || ((alg1 & 0xfffeff00 | 0x20000) == 0x10060000)) &&
         ((char)alg1 == -1)) {
        return alg2;
      }
      if (((uVar1 == 0x10030000) || ((alg2 & 0xfffeff00 | 0x20000) == 0x10060000)) &&
         ((char)alg2 == -1)) {
        return alg1;
      }
    }
    alg1 = 0;
  }
  return alg1;
}

Assistant:

static psa_algorithm_t psa_key_policy_algorithm_intersection(
    psa_algorithm_t alg1,
    psa_algorithm_t alg2 )
{
    /* Common case: both sides actually specify the same policy. */
    if( alg1 == alg2 )
        return( alg1 );
    /* If the policies are from the same hash-and-sign family, check
     * if one is a wildcard. If so the other has the specific algorithm. */
    if( PSA_ALG_IS_HASH_AND_SIGN( alg1 ) &&
        PSA_ALG_IS_HASH_AND_SIGN( alg2 ) &&
        ( alg1 & ~PSA_ALG_HASH_MASK ) == ( alg2 & ~PSA_ALG_HASH_MASK ) )
    {
        if( PSA_ALG_SIGN_GET_HASH( alg1 ) == PSA_ALG_ANY_HASH )
            return( alg2 );
        if( PSA_ALG_SIGN_GET_HASH( alg2 ) == PSA_ALG_ANY_HASH )
            return( alg1 );
    }
    /* If the policies are incompatible, allow nothing. */
    return( 0 );
}